

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O2

void calc_mean_and_sd_weighted<float,unsigned_long,std::vector<double,std::allocator<double>>,double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,double *x_sd,double *x_mean,
               vector<double,_std::allocator<double>_> *w)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  unsigned_long uVar4;
  ulong uVar5;
  bool bVar6;
  unsigned_long *puVar7;
  unsigned_long *puVar8;
  unsigned_long uVar9;
  size_t row;
  double __z;
  double dVar10;
  double dVar11;
  ulong uVar12;
  double dVar13;
  double local_c8;
  double local_a8;
  
  uVar9 = Xc_indptr[col_num];
  uVar4 = Xc_indptr[col_num + 1];
  if (uVar9 == uVar4) {
    *x_sd = 0.0;
    *x_mean = 0.0;
    return;
  }
  puVar2 = Xc_ind + (uVar4 - 1);
  uVar5 = *puVar2;
  puVar3 = ix_arr + end + 1;
  puVar7 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (ix_arr + st,puVar3);
  dVar11 = 0.0;
  for (; st <= end; st = st + 1) {
    dVar11 = dVar11 + (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[ix_arr[st]];
  }
  local_c8 = 0.0;
  local_a8 = 0.0;
  __z = 0.0;
LAB_002c181a:
  puVar1 = Xc_ind + uVar9;
  do {
    if (((puVar7 == puVar3) || (uVar9 == uVar4)) || (uVar12 = *puVar7, uVar5 < uVar12)) {
LAB_002c19da:
      dVar10 = 0.0;
      if ((local_c8 != 0.0) || (NAN(local_c8))) {
        if (local_c8 < dVar11) {
          __z = __z + (1.0 - local_c8 / dVar11) * local_c8 * local_a8 * local_a8;
          local_a8 = local_a8 * (local_c8 / dVar11);
        }
        *x_mean = local_a8;
        dVar10 = SQRT(__z / dVar11);
      }
      else {
        *x_mean = 0.0;
      }
      *x_sd = dVar10;
      return;
    }
    if (*puVar1 == uVar12) {
      dVar10 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar12];
      if ((uint)ABS(Xc[uVar9]) < 0x7f800000) {
        dVar13 = (double)Xc[uVar9];
        bVar6 = local_c8 == 0.0;
        uVar12 = ~-(ulong)bVar6 & (ulong)local_a8;
        local_c8 = local_c8 + dVar10;
        local_a8 = fma(dVar10,(dVar13 - local_a8) / local_c8,local_a8);
        __z = fma(dVar10,(dVar13 - (double)(uVar12 | -(ulong)bVar6 & (ulong)dVar13)) *
                         (dVar13 - local_a8),__z);
      }
      else {
        dVar11 = dVar11 - dVar10;
      }
      if ((puVar7 == ix_arr + end) || (uVar9 == uVar4 - 1)) goto LAB_002c19da;
      puVar7 = puVar7 + 1;
      puVar8 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (puVar1 + 1,puVar2 + 1,puVar7);
      uVar9 = (long)puVar8 - (long)Xc_ind >> 3;
      goto LAB_002c181a;
    }
    if (*puVar1 <= uVar12) break;
    puVar7 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                       (puVar7 + 1,puVar3,puVar1);
  } while( true );
  puVar8 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (puVar1 + 1,puVar2 + 1,puVar7);
  uVar9 = (long)puVar8 - (long)Xc_ind >> 3;
  goto LAB_002c181a;
}

Assistant:

void calc_mean_and_sd_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               double &restrict x_sd, double &restrict x_mean, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt -= w[*row];
            }

            else
            {
                w_this = w[*row];
                if (added == 0) m_prev = Xc[curr_pos];
                added += w_this;
                m = std::fma(w_this, (Xc[curr_pos] - m) / added, m);
                s = std::fma(w_this, (Xc[curr_pos] - m) * (Xc[curr_pos] - m_prev), s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * (added * ((ldouble_safe)1 - (ldouble_safe)added/(ldouble_safe)cnt));
        m *= added / cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (ldouble_safe)cnt);
}